

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void gl4cts::CopyImage::write11F_11F_10F_Channel(GLuint channel,GLdouble value,GLubyte *pixel)

{
  TestError *this;
  Float<unsigned_int,_5,_5,_15,_2U> val_2;
  Float<unsigned_int,_5,_6,_15,_2U> val_1;
  Float<unsigned_int,_5,_6,_15,_2U> val;
  
  if (channel == 2) {
    tcu::Float<unsigned_int,_5,_5,_15,_2U>::Float(&val_2,value);
    val.m_value = val_2.m_value << 0x16;
  }
  else if (channel == 1) {
    tcu::Float<unsigned_int,_5,_6,_15,_2U>::Float(&val_1,value);
    val.m_value = val_1.m_value << 0xb;
  }
  else {
    if (channel != 0) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invalid channel",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                 ,0x8dc);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    tcu::Float<unsigned_int,_5,_6,_15,_2U>::Float(&val,value);
  }
  *(uint *)pixel = *(uint *)pixel | val.m_value;
  return;
}

Assistant:

void write11F_11F_10F_Channel(GLuint channel, GLdouble value, GLubyte* pixel)
{
	deUint32* ptr = (deUint32*)pixel;

	switch (channel)
	{
	case 0:
	{
		tcu::Float<deUint32, 5, 6, 15, tcu::FLOAT_SUPPORT_DENORM> val(value);
		deUint32 bits = val.bits();

		*ptr |= bits;
	}
	break;
	case 1:
	{
		tcu::Float<deUint32, 5, 6, 15, tcu::FLOAT_SUPPORT_DENORM> val(value);
		deUint32 bits = val.bits();

		*ptr |= (bits << 11);
	}
	break;
	case 2:
	{
		tcu::Float<deUint32, 5, 5, 15, tcu::FLOAT_SUPPORT_DENORM> val(value);
		deUint32 bits = val.bits();

		*ptr |= (bits << 22);
	}
	break;
	default:
		TCU_FAIL("Invalid channel");
		break;
	}
}